

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O3

bool __thiscall Am_Input_Char::helper_check_equal(Am_Input_Char *this,Am_Input_Char i)

{
  ushort uVar1;
  short sVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = *(ushort *)&this->field_0x2;
  if ((((uint)i >> 0x13 & 1) == 0 && (uVar1 & 8) == 0) &&
     (((((uint)i >> 0x10 & 1) != (uVar1 & 1) ||
       (((uint)i >> 0x11 & 1) != (uint)((uVar1 >> 1 & 1) != 0))) ||
      (((uint)i >> 0x12 & 1) != (uint)((uVar1 >> 2 & 1) != 0))))) {
    return false;
  }
  sVar2 = this->code;
  if ((int)i << 0x10 == 0x1670000 || sVar2 == 0x167) {
    bVar3 = (uVar1 & 0xf00) == 0 && ((uint)i & 0xf000000) == 0;
  }
  else {
    uVar4 = uVar1 >> 8 & 0xf;
    if (((uVar1 >> 8 & 0xf) == 0) || (uVar5 = (uint)i >> 0x18 & 0xf, uVar5 == 0)) {
      return i.code == sVar2;
    }
    if (uVar5 != uVar4 && (uVar5 != 7 && (short)uVar4 != 7)) {
      return false;
    }
    uVar4 = uVar1 >> 4 & 0xf;
    if ((((short)uVar4 != 3) && (uVar5 = (uint)i >> 0x14 & 0xf, uVar5 != 3)) && (uVar5 != uVar4)) {
      return false;
    }
    bVar3 = true;
    if (i.code != sVar2) {
      return (int)i << 0x10 == 0x1060000 || sVar2 == 0x106;
    }
  }
  return bVar3;
}

Assistant:

bool
Am_Input_Char::helper_check_equal(Am_Input_Char i) const
{
  if (!(any_modifier || i.any_modifier ||
        (shift == i.shift && control == i.control && meta == i.meta)))
    return false; // modifiers don't match

  // now check code
  if (code == Am_ANY_KEYBOARD || i.code == Am_ANY_KEYBOARD) {
    // any_keyboard match
    if (i.click_count == Am_NOT_MOUSE && click_count == Am_NOT_MOUSE)
      return true;
    else
      return false;
  } else if (click_count == Am_NOT_MOUSE || i.click_count == Am_NOT_MOUSE) {
    // specific keyboard key
    if (code == i.code)
      return true;
    else
      return false;
    // note: ignores button up or down for keyboard keys since
    // only support down.
  } else { // here must be a mouse button
    // first, check click count
    if (!(click_count == Am_ANY_CLICK || i.click_count == Am_ANY_CLICK ||
          click_count == i.click_count))
      return false;
    // now button down, up
    if (!(button_down == Am_ANY_DOWN_UP || i.button_down == Am_ANY_DOWN_UP ||
          button_down == i.button_down))
      return false;
    //finally, check code
    if (code == i.code || code == Am_ANY_MOUSE || i.code == Am_ANY_MOUSE)
      return true;
    else
      return false;
  } // end else
}